

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_Message_Test::
MessageDifferencerTest_IgnoreField_Message_Test
          (MessageDifferencerTest_IgnoreField_Message_Test *this)

{
  MessageDifferencerTest_IgnoreField_Message_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__MessageDifferencerTest_IgnoreField_Message_Test_02a24af0;
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_Message) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  proto2_unittest::TestField* field;

  field = msg1.add_rm();
  field->set_c(3);

  field = msg2.add_rm();
  field->set_c(4);

  util::MessageDifferencer differencer;
  differencer.IgnoreField(GetFieldDescriptor(msg1, "rm"));

  ExpectEqualsWithDifferencer(&differencer, msg1, msg2);
}